

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv.cc
# Opt level: O3

int btree_str_kv_is_inf_key(void *key)

{
  if ((*key != (short *)0x0) && (**key == -1)) {
    return 1;
  }
  return 0;
}

Assistant:

int btree_str_kv_is_inf_key(void *key)
{
    void *key_ptr;
    key_len_t keylen, inflen;
    key_len_t _keylen;

    memset(&inflen, 0xff, sizeof(key_len_t));
    memcpy(&key_ptr, key, sizeof(void *));
    if (key_ptr) {
        memcpy(&_keylen, key_ptr, sizeof(key_len_t));
        keylen = _endian_decode(_keylen);
        if (keylen == inflen) {
            return 1;
        }
    }
    return 0;
}